

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  Context *pCVar1;
  RemoveConst<kj::Exception::Detail> *pRVar2;
  ArrayDisposer *pAVar3;
  int iVar4;
  Type TVar5;
  
  (this->ownFile).content.ptr = (other->ownFile).content.ptr;
  (this->ownFile).content.size_ = (other->ownFile).content.size_;
  (this->ownFile).content.disposer = (other->ownFile).content.disposer;
  (other->ownFile).content.ptr = (char *)0x0;
  (other->ownFile).content.size_ = 0;
  iVar4 = other->line;
  TVar5 = other->type;
  this->file = other->file;
  this->line = iVar4;
  this->type = TVar5;
  (this->description).content.ptr = (other->description).content.ptr;
  (this->description).content.size_ = (other->description).content.size_;
  (this->description).content.disposer = (other->description).content.disposer;
  (other->description).content.ptr = (char *)0x0;
  (other->description).content.size_ = 0;
  pCVar1 = (other->context).ptr.ptr;
  (this->context).ptr.disposer = (other->context).ptr.disposer;
  (this->context).ptr.ptr = pCVar1;
  (other->context).ptr.ptr = (Context *)0x0;
  (this->remoteTrace).content.ptr = (other->remoteTrace).content.ptr;
  (this->remoteTrace).content.size_ = (other->remoteTrace).content.size_;
  (this->remoteTrace).content.disposer = (other->remoteTrace).content.disposer;
  (other->remoteTrace).content.ptr = (char *)0x0;
  (other->remoteTrace).content.size_ = 0;
  memcpy(this->trace,other->trace,0x105);
  pRVar2 = (other->details).builder.pos;
  (this->details).builder.ptr = (other->details).builder.ptr;
  (this->details).builder.pos = pRVar2;
  pAVar3 = (other->details).builder.disposer;
  (this->details).builder.endPtr = (other->details).builder.endPtr;
  (this->details).builder.disposer = pAVar3;
  (other->details).builder.endPtr = (Detail *)0x0;
  (other->details).builder.ptr = (Detail *)0x0;
  (other->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  return;
}

Assistant:

Exception(Exception&& other) = default;